

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
wasm::debug::copyDebugInfo(wasm::Expression*,wasm::Expression*,wasm::Function*,wasm::Function*)::
Lister::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  Expression *local_18;
  Expression *curr_local;
  Lister *this_local;
  
  local_18 = curr;
  curr_local = (Expression *)this;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0xd8),
             &local_18);
  return;
}

Assistant:

void visitExpression(Expression* curr) { list.push_back(curr); }